

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

bool ON_SHA1::Validate(void)

{
  bool bVar1;
  int iVar2;
  ON__UINT32 OVar3;
  ON__UINT64 OVar4;
  undefined1 local_c4c [8];
  ON_SHA1_Hash sha1_digestx;
  size_t count;
  size_t min_count;
  ON_RandomNumberGenerator rng;
  ON_SHA1_Hash sha1_digest;
  size_t total_count;
  ON_SHA1 sha1;
  size_t i;
  size_t a_count;
  ON__UINT8 a [200];
  size_t one_million;
  ON__UINT8 millionXa [20];
  ON__UINT8 local_c8 [8];
  ON__UINT8 quickfoxperiod [20];
  ON__UINT8 local_a8 [8];
  ON__UINT8 lazycog [20];
  ON__UINT8 local_88 [8];
  ON__UINT8 quickfox [20];
  ON__UINT8 local_68 [8];
  ON__UINT8 abc_x [20];
  ON__UINT8 local_48 [8];
  ON__UINT8 abc [20];
  ON__UINT8 local_28 [8];
  ON__UINT8 empty_string [20];
  
  local_28[0] = 0xda;
  local_28[1] = '9';
  local_28[2] = 0xa3;
  local_28[3] = 0xee;
  local_28[4] = '^';
  local_28[5] = 'k';
  local_28[6] = 'K';
  local_28[7] = '\r';
  empty_string[0] = '2';
  empty_string[1] = 'U';
  empty_string[2] = 0xbf;
  empty_string[3] = 0xef;
  empty_string[4] = 0x95;
  empty_string[5] = '`';
  empty_string[6] = '\x18';
  empty_string[7] = 0x90;
  empty_string[8] = 0xaf;
  empty_string[9] = 0xd8;
  empty_string[10] = '\a';
  empty_string[0xb] = '\t';
  bVar1 = SHA1_ValidateHelper("",local_28);
  if ((bVar1) && (iVar2 = memcmp(&ON_SHA1_Hash::EmptyContentHash,local_28,0x14), iVar2 == 0)) {
    local_48[0] = 0xa9;
    local_48[1] = 0x99;
    local_48[2] = '>';
    local_48[3] = '6';
    local_48[4] = 'G';
    local_48[5] = '\x06';
    local_48[6] = 0x81;
    local_48[7] = 'j';
    abc[0] = 0xba;
    abc[1] = '>';
    abc[2] = '%';
    abc[3] = 'q';
    abc[4] = 'x';
    abc[5] = 'P';
    abc[6] = 0xc2;
    abc[7] = 'l';
    abc[8] = 0x9c;
    abc[9] = 0xd0;
    abc[10] = 0xd8;
    abc[0xb] = 0x9d;
    bVar1 = SHA1_ValidateHelper("abc",local_48);
    if (bVar1) {
      local_68[0] = 0x84;
      local_68[1] = 0x98;
      local_68[2] = '>';
      local_68[3] = 'D';
      local_68[4] = '\x1c';
      local_68[5] = ';';
      local_68[6] = 0xd2;
      local_68[7] = 'n';
      abc_x[0] = 0xba;
      abc_x[1] = 0xae;
      abc_x[2] = 'J';
      abc_x[3] = 0xa1;
      abc_x[4] = 0xf9;
      abc_x[5] = 'Q';
      abc_x[6] = ')';
      abc_x[7] = 0xe5;
      abc_x[8] = 0xe5;
      abc_x[9] = 'F';
      abc_x[10] = 'p';
      abc_x[0xb] = 0xf1;
      bVar1 = SHA1_ValidateHelper("abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
                                  local_68);
      if (bVar1) {
        local_88[0] = '/';
        local_88[1] = 0xd4;
        local_88[2] = 0xe1;
        local_88[3] = 0xc6;
        local_88[4] = 'z';
        local_88[5] = '-';
        local_88[6] = '(';
        local_88[7] = 0xfc;
        quickfox[0] = 0xed;
        quickfox[1] = 0x84;
        quickfox[2] = 0x9e;
        quickfox[3] = 0xe1;
        quickfox[4] = 0xbb;
        quickfox[5] = 'v';
        quickfox[6] = 0xe7;
        quickfox[7] = '9';
        quickfox[8] = '\x1b';
        quickfox[9] = 0x93;
        quickfox[10] = 0xeb;
        quickfox[0xb] = '\x12';
        bVar1 = SHA1_ValidateHelper("The quick brown fox jumps over the lazy dog",local_88);
        if (bVar1) {
          local_a8[0] = 0xde;
          local_a8[1] = 0x9f;
          local_a8[2] = ',';
          local_a8[3] = '\x7f';
          local_a8[4] = 0xd2;
          local_a8[5] = '^';
          local_a8[6] = '\x1b';
          local_a8[7] = ':';
          lazycog[0] = 0xfa;
          lazycog[1] = 0xd3;
          lazycog[2] = 0xe8;
          lazycog[3] = 'Z';
          lazycog[4] = '\v';
          lazycog[5] = 0xd1;
          lazycog[6] = '}';
          lazycog[7] = 0x9b;
          lazycog[8] = '\x10';
          lazycog[9] = '\r';
          lazycog[10] = 0xb4;
          lazycog[0xb] = 0xb3;
          bVar1 = SHA1_ValidateHelper("The quick brown fox jumps over the lazy cog",local_a8);
          if (bVar1) {
            local_c8[0] = '@';
            local_c8[1] = 0x8d;
            local_c8[2] = 0x94;
            local_c8[3] = '8';
            local_c8[4] = 'B';
            local_c8[5] = '\x16';
            local_c8[6] = 0xf8;
            local_c8[7] = 0x90;
            quickfoxperiod[0] = 0xff;
            quickfoxperiod[1] = 'z';
            quickfoxperiod[2] = '\f';
            quickfoxperiod[3] = '5';
            quickfoxperiod[4] = '(';
            quickfoxperiod[5] = 0xe8;
            quickfoxperiod[6] = 0xbe;
            quickfoxperiod[7] = 0xd1;
            quickfoxperiod[8] = 0xe0;
            quickfoxperiod[9] = 0xb0;
            quickfoxperiod[10] = '\x16';
            quickfoxperiod[0xb] = '!';
            bVar1 = SHA1_ValidateHelper("The quick brown fox jumps over the lazy dog.",local_c8);
            if (bVar1) {
              one_million = 0xa4dac4d43c97aa34;
              millionXa[0] = 0xf6;
              millionXa[1] = '\x1e';
              millionXa[2] = 0xeb;
              millionXa[3] = '+';
              millionXa[4] = 0xdb;
              millionXa[5] = 0xad;
              millionXa[6] = '\'';
              millionXa[7] = '1';
              millionXa[8] = 'e';
              millionXa[9] = '4';
              millionXa[10] = '\x01';
              millionXa[0xb] = 'o';
              builtin_memcpy(a + 0xc0,"@B\x0f",4);
              a[0xc4] = '\0';
              a[0xc5] = '\0';
              a[0xc6] = '\0';
              a[199] = '\0';
              sha1.m_sha1_hash.m_digest[0xc] = '\0';
              sha1.m_sha1_hash.m_digest[0xd] = '\0';
              sha1.m_sha1_hash.m_digest[0xe] = '\0';
              sha1.m_sha1_hash.m_digest[0xf] = '\0';
              sha1.m_sha1_hash.m_digest[0x10] = '\0';
              sha1.m_sha1_hash.m_digest[0x11] = '\0';
              sha1.m_sha1_hash.m_digest[0x12] = '\0';
              sha1.m_sha1_hash.m_digest[0x13] = '\0';
              for (; (ulong)sha1.m_sha1_hash.m_digest._12_8_ < 200;
                  sha1.m_sha1_hash.m_digest._12_8_ = sha1.m_sha1_hash.m_digest._12_8_ + 1) {
                a[sha1.m_sha1_hash.m_digest._12_8_ + -8] = 'a';
              }
              ON_SHA1((ON_SHA1 *)&total_count);
              sha1_digest.m_digest[0xc] = '\0';
              sha1_digest.m_digest[0xd] = '\0';
              sha1_digest.m_digest[0xe] = '\0';
              sha1_digest.m_digest[0xf] = '\0';
              sha1_digest.m_digest[0x10] = '\0';
              sha1_digest.m_digest[0x11] = '\0';
              sha1_digest.m_digest[0x12] = '\0';
              sha1_digest.m_digest[0x13] = '\0';
              for (; (ulong)sha1_digest.m_digest._12_8_ < 1000000;
                  sha1_digest.m_digest._12_8_ = sha1_digest.m_digest._12_8_ + 200) {
                AccumulateBytes((ON_SHA1 *)&total_count,&a_count,200);
                OVar4 = ByteCount((ON_SHA1 *)&total_count);
                if (OVar4 != sha1_digest.m_digest._12_8_ + 200) {
                  return false;
                }
              }
              Hash((ON_SHA1_Hash *)(rng.m_rand_context.mt + 0x26e),(ON_SHA1 *)&total_count);
              iVar2 = memcmp(rng.m_rand_context.mt + 0x26e,&one_million,0x14);
              if (iVar2 == 0) {
                Reset((ON_SHA1 *)&total_count);
                ON_RandomNumberGenerator::ON_RandomNumberGenerator
                          ((ON_RandomNumberGenerator *)&min_count);
                sha1_digest.m_digest[0xc] = '\0';
                sha1_digest.m_digest[0xd] = '\0';
                sha1_digest.m_digest[0xe] = '\0';
                sha1_digest.m_digest[0xf] = '\0';
                sha1_digest.m_digest[0x10] = '\0';
                sha1_digest.m_digest[0x11] = '\0';
                sha1_digest.m_digest[0x12] = '\0';
                sha1_digest.m_digest[0x13] = '\0';
                do {
                  if (999999 < (ulong)sha1_digest.m_digest._12_8_) {
                    Hash((ON_SHA1_Hash *)local_c4c,(ON_SHA1 *)&total_count);
                    iVar2 = memcmp(local_c4c,&one_million,0x14);
                    if (iVar2 == 0) {
                      return true;
                    }
                    return false;
                  }
                  OVar3 = ON_RandomNumberGenerator::RandomNumber
                                    ((ON_RandomNumberGenerator *)&min_count);
                  sha1_digestx.m_digest._12_8_ = (ulong)OVar3 % 100 + 100;
                  if (1000000 < (ulong)(sha1_digest.m_digest._12_8_ + sha1_digestx.m_digest._12_8_))
                  {
                    sha1_digestx.m_digest._12_8_ = 1000000 - sha1_digest.m_digest._12_8_;
                  }
                  AccumulateBytes((ON_SHA1 *)&total_count,&a_count,sha1_digestx.m_digest._12_8_);
                  sha1_digest.m_digest._12_8_ =
                       sha1_digestx.m_digest._12_8_ + sha1_digest.m_digest._12_8_;
                  OVar4 = ByteCount((ON_SHA1 *)&total_count);
                } while (OVar4 == sha1_digest.m_digest._12_8_);
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_SHA1::Validate()
{
  // "" (empty string)
  // da39a3ee 5e6b4b0d 3255bfef 95601890 afd80709
  const ON__UINT8 empty_string[20] = {
    0xda, 0x39, 0xa3, 0xee,
    0x5e, 0x6b, 0x4b, 0x0d,
    0x32, 0x55, 0xbf, 0xef,
    0x95, 0x60, 0x18, 0x90,
    0xaf, 0xd8, 0x07, 0x09 
  };
  if (false == SHA1_ValidateHelper("",empty_string))
    return false;

  
  if (0 != memcmp(&ON_SHA1_Hash::EmptyContentHash ,empty_string, sizeof(empty_string)))
    return false;

  // "abc"
  // a9993e36 4706816a ba3e2571 7850c26c 9cd0d89d
  const ON__UINT8 abc[20]  = { 
    0xa9, 0x99, 0x3e, 0x36,
    0x47, 0x06, 0x81, 0x6a,
    0xba, 0x3e, 0x25, 0x71,
    0x78, 0x50, 0xc2, 0x6c,
    0x9c, 0xd0, 0xd8, 0x9d  
  };
  if (false == SHA1_ValidateHelper("abc",abc))
    return false;

  // "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq"
  // 84983e44 1c3bd26e baae4aa1 f95129e5 e54670f1
  const ON__UINT8 abc_x[20] = { 
    0x84, 0x98, 0x3e, 0x44,
    0x1c, 0x3b, 0xd2, 0x6e,
    0xba, 0xae, 0x4a, 0xa1,
    0xf9, 0x51, 0x29, 0xe5,
    0xe5, 0x46, 0x70, 0xf1 
  };
  if (false == SHA1_ValidateHelper("abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",abc_x))
    return false;

  // "The quick brown fox jumps over the lazy dog"
  // 2fd4e1c6 7a2d28fc ed849ee1 bb76e739 1b93eb12
  const ON__UINT8 quickfox[20] = {
    0x2f, 0xd4, 0xe1, 0xc6,
    0x7a, 0x2d, 0x28, 0xfc,
    0xed, 0x84, 0x9e, 0xe1,
    0xbb, 0x76, 0xe7, 0x39,
    0x1b, 0x93, 0xeb, 0x12 
  };
  if (false == SHA1_ValidateHelper("The quick brown fox jumps over the lazy dog",quickfox))
    return false;

  // "The quick brown fox jumps over the lazy cog"
  // de9f2c7f d25e1b3a fad3e85a 0bd17d9b 100db4b3
  const ON__UINT8 lazycog[20] = {
    0xde, 0x9f, 0x2c, 0x7f,
    0xd2, 0x5e, 0x1b, 0x3a,
    0xfa, 0xd3, 0xe8, 0x5a,
    0x0b, 0xd1, 0x7d, 0x9b,
    0x10, 0x0d, 0xb4, 0xb3 
  };
  if (false == SHA1_ValidateHelper("The quick brown fox jumps over the lazy cog",lazycog))
    return false;

  // "The quick brown fox jumps over the lazy dog."
  // 408d9438 4216f890 ff7a0c35 28e8bed1 e0b01621
  const ON__UINT8 quickfoxperiod[20] = {
    0x40, 0x8d, 0x94, 0x38,
    0x42, 0x16, 0xf8, 0x90,
    0xff, 0x7a, 0x0c, 0x35,
    0x28, 0xe8, 0xbe, 0xd1,
    0xe0, 0xb0, 0x16, 0x21 
  };
  if (false == SHA1_ValidateHelper("The quick brown fox jumps over the lazy dog.",quickfoxperiod))
    return false;

  // 1,000,000 repetitions of the character "a".
  // 34AA973C D4C4DAA4 F61EEB2B DBAD2731 6534016F
  const ON__UINT8 millionXa[20] = {
    0x34, 0xAA, 0x97, 0x3C,
    0xD4, 0xC4, 0xDA, 0xA4,
    0xF6, 0x1E, 0xEB, 0x2B,
    0xDB, 0xAD, 0x27, 0x31,
    0x65, 0x34, 0x01, 0x6F 
  };

  const size_t one_million = 1000000;
  ON__UINT8 a[200];
  const size_t a_count = sizeof(a) / sizeof(a[0]);
  for ( size_t i = 0; i < a_count; i++)
    a[i] = 'a';  
  ON_SHA1 sha1;
  size_t total_count = 0;
  for (total_count = 0; total_count < one_million; total_count += a_count)
  {
    sha1.AccumulateBytes(a, a_count);
    if (sha1.ByteCount() != (ON__UINT64)(total_count+a_count))
      return false;
  }
  
  ON_SHA1_Hash sha1_digest(sha1.Hash());

  if (0 != memcmp(&sha1_digest,millionXa,sizeof(millionXa)))
    return false;

  sha1.Reset();
  ON_RandomNumberGenerator rng;
  total_count = 0; 
  const size_t min_count = (a_count >= 10000) ? a_count/1000 : 100;
  while (total_count < one_million)
  {
    size_t count = min_count + (rng.RandomNumber() % (ON__UINT32)min_count);
    if ( total_count + count > one_million )
      count = one_million - total_count;
    sha1.AccumulateBytes(a, count);
    total_count += count;
    if (sha1.ByteCount() != (ON__UINT64)total_count)
      return false;
  }

  
  ON_SHA1_Hash sha1_digestx(sha1.Hash());

  if (0 != memcmp(&sha1_digestx,millionXa,sizeof(millionXa)))
    return false;

  return true;
}